

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall
test_flash_attn_ext::build_graph(test_flash_attn_ext *this,ggml_context *ctx)

{
  long lVar1;
  ggml_context *pgVar2;
  long lVar3;
  long lVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ulong ne0;
  float fVar8;
  ggml_context *ctx_local;
  ggml_tensor *local_48;
  anon_class_16_2_633b7154 local_40;
  
  lVar1 = this->hsk;
  ctx_local = ctx;
  lVar3 = ggml_blck_size(this->type_KV);
  lVar4 = ggml_blck_size(this->type_KV);
  ne0 = (lVar1 + lVar3) - 1U & -lVar4;
  lVar1 = this->hsv;
  lVar3 = ggml_blck_size(this->type_KV);
  lVar4 = ggml_blck_size(this->type_KV);
  pgVar7 = (ggml_tensor *)0x0;
  local_40.this = this;
  local_40.ctx = &ctx_local;
  local_48 = build_graph::anon_class_16_2_633b7154::operator()
                       (&local_40,GGML_TYPE_F32,ne0,this->nb,this->nr * this->nh,1);
  ggml_set_name(local_48,"q");
  pgVar5 = build_graph::anon_class_16_2_633b7154::operator()
                     (&local_40,this->type_KV,ne0,this->kv,this->nh,1);
  ggml_set_name(pgVar5,"k");
  pgVar6 = build_graph::anon_class_16_2_633b7154::operator()
                     (&local_40,this->type_KV,(lVar1 + lVar3) - 1U & -lVar4,this->kv,this->nh,1);
  ggml_set_name(pgVar6,"v");
  if (this->mask == true) {
    pgVar7 = test_case::ggml_new_tensor_4d
                       (&this->super_test_case,ctx_local,GGML_TYPE_F16,this->kv,
                        this->nb + 0x3fU & 0xffffffffffffffc0,1,1);
    ggml_set_name(pgVar7,"m");
  }
  pgVar2 = ctx_local;
  fVar8 = (float)this->hsk;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  pgVar5 = (ggml_tensor *)
           ggml_flash_attn_ext(1.0 / fVar8,this->max_bias,this->logit_softcap,pgVar2,local_48,pgVar5
                               ,pgVar6,pgVar7);
  ggml_flash_attn_ext_set_prec(pgVar5,this->prec);
  ggml_set_name(pgVar5,"out");
  return pgVar5;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        const int64_t hsk_padded = GGML_PAD(hsk, ggml_blck_size(type_KV));
        const int64_t hsv_padded = GGML_PAD(hsv, ggml_blck_size(type_KV));

        auto const &create_permuted = [&](ggml_type type, int64_t ne0, int64_t ne1, int64_t ne2, int64_t ne3) -> ggml_tensor * {
            int64_t ne[4] = {ne0, ne1, ne2, ne3};
            int64_t ne_perm[4];
            for (int i = 0; i < 4; ++i) {
                ne_perm[permute[i]] = ne[i];
            }
            ggml_tensor * t = ggml_new_tensor_4d(ctx, type, ne_perm[0], ne_perm[1], ne_perm[2], ne_perm[3]);
            if (permute != std::array<int32_t, 4>{0, 1, 2, 3}) {
                t = ggml_permute(ctx, t, permute[0], permute[1], permute[2], permute[3]);
            }
            return t;
        };

        ggml_tensor * q = create_permuted(GGML_TYPE_F32, hsk_padded, nb, nh*nr, 1);
        ggml_set_name(q, "q");

        ggml_tensor * k = create_permuted(type_KV,       hsk_padded, kv, nh,    1);
        ggml_set_name(k, "k");

        ggml_tensor * v = create_permuted(type_KV,       hsv_padded, kv, nh,    1);
        ggml_set_name(v, "v");

        ggml_tensor * m = nullptr;
        if (mask) {
            m = ggml_new_tensor_4d(ctx, GGML_TYPE_F16, kv, GGML_PAD(nb, GGML_KQ_MASK_PAD), 1, 1);
            ggml_set_name(m, "m");
        }

        ggml_tensor * out = ggml_flash_attn_ext(ctx, q, k, v, m, 1.0f/sqrtf(hsk), max_bias, logit_softcap);
        ggml_flash_attn_ext_set_prec(out, prec);
        ggml_set_name(out, "out");

        return out;
    }